

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O0

string * ON_UTF32_to_std_string_abi_cxx11_
                   (int bTestByteOrder,ON__UINT32 *sUTF32,int sUTF32_count,uint *error_status,
                   uint error_mask,ON__UINT32 error_code_point,ON__UINT32 **sNextUTF32)

{
  undefined4 in_register_00000014;
  undefined4 in_register_0000003c;
  string *this;
  undefined4 in_register_00000084;
  uint *puVar1;
  long *in_stack_00000010;
  int local_290;
  int local_28c;
  int local_288;
  exception *anon_var_0;
  int out_count;
  int in_count;
  int rc;
  ON__UINT32 *sNextIn;
  uint es;
  int buffer_count;
  char buffer [512];
  uint error_mask_local;
  uint *error_status_local;
  ON__UINT32 *pOStack_20;
  int sUTF32_count_local;
  ON__UINT32 *sUTF32_local;
  int bTestByteOrder_local;
  string *str;
  
  puVar1 = (uint *)CONCAT44(in_register_00000084,error_mask);
  this = (string *)CONCAT44(in_register_0000003c,bTestByteOrder);
  pOStack_20 = (ON__UINT32 *)CONCAT44(in_register_00000014,sUTF32_count);
  sUTF32_local._4_4_ = (int)sUTF32;
  error_status_local._4_4_ = (int)error_status;
  buffer[0x1fb] = '\0';
  buffer._508_4_ = error_code_point;
  std::__cxx11::string::string(this);
  sNextIn._4_4_ = 0x200;
  if ((error_status_local._4_4_ == -1) && (pOStack_20 != (ON__UINT32 *)0x0)) {
    for (error_status_local._4_4_ = 0; pOStack_20[error_status_local._4_4_] != 0;
        error_status_local._4_4_ = error_status_local._4_4_ + 1) {
    }
  }
  buffer[0x1f7] = '\0';
  if (puVar1 != (uint *)0x0) {
    *puVar1 = 0;
  }
  while( true ) {
    sNextIn._0_4_ = 0;
    _in_count = (ON__UINT32 *)0x0;
    local_290 = ON_ConvertUTF32ToUTF8
                          (sUTF32_local._4_4_,pOStack_20,error_status_local._4_4_,(char *)&es,0x1ff,
                           (uint *)&sNextIn,buffer._508_4_,(ON__UINT32)sNextUTF32,
                           (ON__UINT32 **)&in_count);
    if ((local_290 < 0) || (local_288 = local_290, 0x1ff < local_290)) {
      local_288 = 0;
    }
    *(undefined1 *)((long)&es + (long)local_288) = 0;
    if (((_in_count == (ON__UINT32 *)0x0) || (pOStack_20 == (ON__UINT32 *)0x0)) ||
       (_in_count <= pOStack_20)) {
      local_28c = 0;
    }
    else {
      local_28c = (int)((long)_in_count - (long)pOStack_20 >> 2);
    }
    if (((local_28c < 1) || (local_290 < 1)) || (0x1ff < local_290)) {
      local_290 = 0;
    }
    if (0 < local_290) {
      std::__cxx11::string::append((char *)this,(ulong)&es);
    }
    pOStack_20 = pOStack_20 + local_28c;
    error_status_local._4_4_ = error_status_local._4_4_ - local_28c;
    if (((((uint)sNextIn & 2) != 0) && (0 < local_28c)) && (0 < local_290)) {
      sNextIn._0_4_ = (uint)sNextIn & 0xfffffffd;
    }
    if (puVar1 != (uint *)0x0) {
      *puVar1 = (uint)sNextIn | *puVar1;
    }
    if ((((error_status_local._4_4_ < 1) || (local_28c < 1)) || (local_290 < 1)) ||
       (((uint)sNextIn & 3) != 0)) break;
    sUTF32_local._4_4_ = 0;
  }
  if (in_stack_00000010 != (long *)0x0) {
    *in_stack_00000010 = (long)pOStack_20;
  }
  return this;
}

Assistant:

std::string ON_UTF32_to_std_string(
  int bTestByteOrder,
  const ON__UINT32* sUTF32,
  int sUTF32_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  const ON__UINT32** sNextUTF32
  ) ON_NOEXCEPT
{
  std::string str;
  char buffer[512];
  const int buffer_count = static_cast<int>(sizeof(buffer)/sizeof(buffer[0]));
  unsigned int es;
  const ON__UINT32* sNextIn;

  if ( -1 == sUTF32_count && 0 != sUTF32 )
  {
    for ( sUTF32_count = 0; 0 != sUTF32[sUTF32_count]; sUTF32_count++)
    {
      // empty for body
    }
  }

  buffer[buffer_count-1] = 0;

  if ( 0 != error_status )
    *error_status = 0;

  for(;;)
  {
    es = 0;
    sNextIn = 0;
    int rc = ON_ConvertUTF32ToUTF8(
      bTestByteOrder, sUTF32, sUTF32_count,
      buffer, buffer_count-1,
      &es, error_mask, error_code_point,
      &sNextIn
      );

    // insure buffer[] is null terminated.
    buffer[( rc >= 0 && rc < buffer_count) ? rc : 0] = 0;

    // in_count = number of input sUTF32[] elements that were processed
    int in_count = ( 0 != sNextIn && 0 != sUTF32 && sNextIn > sUTF32 )
      ? static_cast<int>(sNextIn - sUTF32)
      : 0;

    // out_count = number of UTF-8 output values
    int out_count = ( in_count > 0 && rc > 0 && rc < buffer_count) ? rc : 0;

    if ( out_count > 0 )
    {
      try {
        str.append(buffer,out_count);
      } catch (const std::exception& ) {
        es |= 2;
        in_count = 0;
        out_count = 0;
      }
    }

    sUTF32 += in_count;
    sUTF32_count -= in_count;

    if ( 0 != (0x02 & es) && in_count > 0 && out_count > 0 )
    {
      // buffer[] was not long enough and we made progress.
      // Clear bit 2 and allow further processing
      es &= 0xFFFFFFFD;
    }

    if ( 0 != error_status )
      *error_status |= es;

    if ( sUTF32_count > 0 && in_count > 0 && out_count > 0 && 0 == (es & 3) )
    {
      // There were no blocking errors, we made progress, and there is more input
      bTestByteOrder = false;
      continue;
    }

    break; // finished
  }

  if ( sNextUTF32 )
    *sNextUTF32 = sUTF32;

  // On modern compilers, this return will use an efficient rvalue reference.
  return str;
}